

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.hpp
# Opt level: O0

TokenRefCount<antlr::Token> * __thiscall
antlr::TokenRefCount<antlr::Token>::operator=
          (TokenRefCount<antlr::Token> *this,TokenRefCount<antlr::Token> *other)

{
  bool bVar1;
  long *in_RSI;
  TokenRefCount<antlr::Token> *in_RDI;
  TokenRef *tmp;
  TokenRef *this_00;
  TokenRef *local_28;
  
  if ((TokenRef *)*in_RSI != in_RDI->ref) {
    if (*in_RSI == 0) {
      local_28 = (TokenRef *)0x0;
    }
    else {
      local_28 = TokenRef::increment((TokenRef *)*in_RSI);
    }
    if (((in_RDI->ref != (TokenRef *)0x0) && (bVar1 = TokenRef::decrement(in_RDI->ref), bVar1)) &&
       (this_00 = in_RDI->ref, this_00 != (TokenRef *)0x0)) {
      TokenRef::~TokenRef(this_00);
      operator_delete(this_00,0x10);
    }
    in_RDI->ref = local_28;
  }
  return in_RDI;
}

Assistant:

TokenRefCount<T>& operator=(const TokenRefCount<T>& other)
	{
		if( other.ref != ref )
		{
			TokenRef* tmp = other.ref ? other.ref->increment() : 0;

			if (ref && ref->decrement())
				delete ref;

			ref=tmp;
		}
		return *this;
	}